

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDwaCompressor.cpp
# Opt level: O2

void __thiscall Imf_2_5::DwaCompressor::initializeDefaultChannelRules(DwaCompressor *this)

{
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>
  *this_00;
  allocator<char> local_219;
  Classifier local_218;
  string local_1e8;
  string local_1c8;
  string local_1a8;
  string local_188;
  string local_168;
  string local_148;
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  string local_28;
  
  this_00 = &this->_channelRules;
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  clear(this_00);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"R",&local_219);
  Classifier::Classifier(&local_218,&local_28,LOSSY_DCT,HALF,0,false);
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  emplace_back<Imf_2_5::DwaCompressor::Classifier>(this_00,&local_218);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"R",&local_219);
  Classifier::Classifier(&local_218,&local_48,LOSSY_DCT,FLOAT,0,false);
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  emplace_back<Imf_2_5::DwaCompressor::Classifier>(this_00,&local_218);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"G",&local_219);
  Classifier::Classifier(&local_218,&local_68,LOSSY_DCT,HALF,1,false);
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  emplace_back<Imf_2_5::DwaCompressor::Classifier>(this_00,&local_218);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"G",&local_219);
  Classifier::Classifier(&local_218,&local_88,LOSSY_DCT,FLOAT,1,false);
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  emplace_back<Imf_2_5::DwaCompressor::Classifier>(this_00,&local_218);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"B",&local_219);
  Classifier::Classifier(&local_218,&local_a8,LOSSY_DCT,HALF,2,false);
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  emplace_back<Imf_2_5::DwaCompressor::Classifier>(this_00,&local_218);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"B",&local_219);
  Classifier::Classifier(&local_218,&local_c8,LOSSY_DCT,FLOAT,2,false);
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  emplace_back<Imf_2_5::DwaCompressor::Classifier>(this_00,&local_218);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"Y",&local_219);
  Classifier::Classifier(&local_218,&local_e8,LOSSY_DCT,HALF,-1,false);
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  emplace_back<Imf_2_5::DwaCompressor::Classifier>(this_00,&local_218);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"Y",&local_219);
  Classifier::Classifier(&local_218,&local_108,LOSSY_DCT,FLOAT,-1,false);
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  emplace_back<Imf_2_5::DwaCompressor::Classifier>(this_00,&local_218);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,"BY",&local_219);
  Classifier::Classifier(&local_218,&local_128,LOSSY_DCT,HALF,-1,false);
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  emplace_back<Imf_2_5::DwaCompressor::Classifier>(this_00,&local_218);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_148,"BY",&local_219);
  Classifier::Classifier(&local_218,&local_148,LOSSY_DCT,FLOAT,-1,false);
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  emplace_back<Imf_2_5::DwaCompressor::Classifier>(this_00,&local_218);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_168,"RY",&local_219);
  Classifier::Classifier(&local_218,&local_168,LOSSY_DCT,HALF,-1,false);
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  emplace_back<Imf_2_5::DwaCompressor::Classifier>(this_00,&local_218);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_188,"RY",&local_219);
  Classifier::Classifier(&local_218,&local_188,LOSSY_DCT,FLOAT,-1,false);
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  emplace_back<Imf_2_5::DwaCompressor::Classifier>(this_00,&local_218);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a8,"A",&local_219);
  Classifier::Classifier(&local_218,&local_1a8,RLE,UINT,-1,false);
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  emplace_back<Imf_2_5::DwaCompressor::Classifier>(this_00,&local_218);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c8,"A",&local_219);
  Classifier::Classifier(&local_218,&local_1c8,RLE,HALF,-1,false);
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  emplace_back<Imf_2_5::DwaCompressor::Classifier>(this_00,&local_218);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e8,"A",&local_219);
  Classifier::Classifier(&local_218,&local_1e8,RLE,FLOAT,-1,false);
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  emplace_back<Imf_2_5::DwaCompressor::Classifier>(this_00,&local_218);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_1e8);
  return;
}

Assistant:

void
DwaCompressor::initializeDefaultChannelRules ()
{
    _channelRules.clear();

    _channelRules.push_back (Classifier ("R",     LOSSY_DCT, HALF,   0, false));
    _channelRules.push_back (Classifier ("R",     LOSSY_DCT, FLOAT,  0, false));
    _channelRules.push_back (Classifier ("G",     LOSSY_DCT, HALF,   1, false));
    _channelRules.push_back (Classifier ("G",     LOSSY_DCT, FLOAT,  1, false));
    _channelRules.push_back (Classifier ("B",     LOSSY_DCT, HALF,   2, false));
    _channelRules.push_back (Classifier ("B",     LOSSY_DCT, FLOAT,  2, false));

    _channelRules.push_back (Classifier ("Y",     LOSSY_DCT, HALF,  -1, false));
    _channelRules.push_back (Classifier ("Y",     LOSSY_DCT, FLOAT, -1, false));
    _channelRules.push_back (Classifier ("BY",    LOSSY_DCT, HALF,  -1, false));
    _channelRules.push_back (Classifier ("BY",    LOSSY_DCT, FLOAT, -1, false));
    _channelRules.push_back (Classifier ("RY",    LOSSY_DCT, HALF,  -1, false));
    _channelRules.push_back (Classifier ("RY",    LOSSY_DCT, FLOAT, -1, false));

    _channelRules.push_back (Classifier ("A",     RLE,       UINT,  -1, false));
    _channelRules.push_back (Classifier ("A",     RLE,       HALF,  -1, false));
    _channelRules.push_back (Classifier ("A",     RLE,       FLOAT, -1, false));
}